

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

value * __thiscall
mjs::interpreter::impl::eval(value *__return_storage_ptr__,impl *this,expression *e)

{
  accept<mjs::interpreter::impl>(__return_storage_ptr__,e,this);
  return __return_storage_ptr__;
}

Assistant:

value eval(const expression& e) {
        try {
#ifdef MJS_GC_STRESS_TEST
            // Typical causes of crashes when the stress test is enabled:
            //  - `some_ptr->func(eval(...))`: `some_ptr->` can be evaluated before `eval(...)`
            //  - holding pointers to GC objects past calls to eval (be aware of indirect calls like calling a user provided sorting predicate)
            //    Note that `this` is counted for native function implementations (!) see Array.sort for an example
            auto res = accept(e, *this);
            heap_.garbage_collect();
            return res;
#else
            return accept(e, *this);
#endif
        } catch (const not_supported_exception& e) {
            throw native_error_exception{native_error_type::assertion, stack_trace(), e.what()};
        } catch (const to_primitive_failed_error& e) {
            throw native_error_exception{native_error_type::type, stack_trace(), e.what()};
        } catch (const no_internal_value& e) {
            throw native_error_exception{native_error_type::type, stack_trace(), e.what()};
        } catch (const not_callable_exception& e) {
            throw native_error_exception{native_error_type::type, stack_trace(), e.what()};
#if 0
        } catch (std::exception& e) {
            std::wcerr << e.what() << " at\n" << stack_trace() << "\n\n";
            throw;
#endif
        }
    }